

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O3

int mbedtls_rsa_pkcs1_verify
              (mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,
              int mode,mbedtls_md_type_t md_alg,uint hashlen,uchar *hash,uchar *sig)

{
  int iVar1;
  mbedtls_md_type_t mgf1_hash_id;
  
  if (ctx->padding == 1) {
    mgf1_hash_id = ctx->hash_id;
    if (ctx->hash_id == MBEDTLS_MD_NONE) {
      mgf1_hash_id = md_alg;
    }
    iVar1 = mbedtls_rsa_rsassa_pss_verify_ext
                      (ctx,f_rng,p_rng,mode,md_alg,hashlen,hash,mgf1_hash_id,-1,sig);
    return iVar1;
  }
  if (ctx->padding == 0) {
    iVar1 = mbedtls_rsa_rsassa_pkcs1_v15_verify(ctx,f_rng,p_rng,mode,md_alg,hashlen,hash,sig);
    return iVar1;
  }
  return -0x4100;
}

Assistant:

int mbedtls_rsa_pkcs1_verify( mbedtls_rsa_context *ctx,
                      int (*f_rng)(void *, unsigned char *, size_t),
                      void *p_rng,
                      int mode,
                      mbedtls_md_type_t md_alg,
                      unsigned int hashlen,
                      const unsigned char *hash,
                      const unsigned char *sig )
{
    switch( ctx->padding )
    {
#if defined(MBEDTLS_PKCS1_V15)
        case MBEDTLS_RSA_PKCS_V15:
            return mbedtls_rsa_rsassa_pkcs1_v15_verify( ctx, f_rng, p_rng, mode, md_alg,
                                                hashlen, hash, sig );
#endif

#if defined(MBEDTLS_PKCS1_V21)
        case MBEDTLS_RSA_PKCS_V21:
            return mbedtls_rsa_rsassa_pss_verify( ctx, f_rng, p_rng, mode, md_alg,
                                          hashlen, hash, sig );
#endif

        default:
            return( MBEDTLS_ERR_RSA_INVALID_PADDING );
    }
}